

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileMtlImporter::ObjFileMtlImporter
          (ObjFileMtlImporter *this,vector<char,_std::allocator<char>_> *buffer,string *param_2,
          Model *pModel)

{
  iterator iVar1;
  Material *this_00;
  Model *pModel_local;
  string *param_2_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  ObjFileMtlImporter *this_local;
  
  std::__cxx11::string::string((string *)this);
  iVar1 = std::vector<char,_std::allocator<char>_>::begin(buffer);
  (this->m_DataIt)._M_current = iVar1._M_current;
  iVar1 = std::vector<char,_std::allocator<char>_>::end(buffer);
  (this->m_DataItEnd)._M_current = iVar1._M_current;
  this->m_pModel = pModel;
  this->m_uiLine = 0;
  if (this->m_pModel != (Model *)0x0) {
    if (this->m_pModel->m_pDefaultMaterial == (Material *)0x0) {
      this_00 = (Material *)operator_new(0x409c);
      ObjFile::Material::Material(this_00);
      this->m_pModel->m_pDefaultMaterial = this_00;
      aiString::Set(&this->m_pModel->m_pDefaultMaterial->MaterialName,"default");
    }
    load(this);
    return;
  }
  __assert_fail("__null != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileMtlImporter.cpp"
                ,0x61,
                "Assimp::ObjFileMtlImporter::ObjFileMtlImporter(std::vector<char> &, const std::string &, ObjFile::Model *)"
               );
}

Assistant:

ObjFileMtlImporter::ObjFileMtlImporter( std::vector<char> &buffer,
                                       const std::string &,
                                       ObjFile::Model *pModel ) :
    m_DataIt( buffer.begin() ),
    m_DataItEnd( buffer.end() ),
    m_pModel( pModel ),
    m_uiLine( 0 )
{
    ai_assert( NULL != m_pModel );
    if ( NULL == m_pModel->m_pDefaultMaterial )
    {
        m_pModel->m_pDefaultMaterial = new ObjFile::Material;
        m_pModel->m_pDefaultMaterial->MaterialName.Set( "default" );
    }
    load();
}